

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O3

bool __thiscall ON_EmbeddedFile::Read(ON_EmbeddedFile *this,ON_BinaryArchive *archive)

{
  CImpl *pCVar1;
  bool bVar2;
  wchar_t *dirty_path;
  ON__UINT64 OVar3;
  ON__UINT64 OVar4;
  bool bFailedCRC;
  size_t uncompressed_size;
  ON_wString filename;
  bool local_39;
  ON_wString local_38;
  ON_wString local_30;
  
  (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x21])();
  ON_wString::ON_wString(&local_30);
  bVar2 = ON_BinaryArchive::ReadString(archive,&local_30);
  if (bVar2) {
    dirty_path = ON_wString::operator_cast_to_wchar_t_(&local_30);
    ON_FileSystemPath::CleanPath((ON_FileSystemPath *)&local_38,dirty_path);
    ON_wString::operator=(&this->m_impl->m_orig_file,&local_38);
    ON_wString::~ON_wString(&local_38);
    local_38.m_s = (wchar_t *)0x0;
    bVar2 = ON_BinaryArchive::ReadCompressedBufferSize(archive,(size_t *)&local_38);
    pCVar1 = this->m_impl;
    if (bVar2) {
      CImpl::Data::SetLength(&pCVar1->m_data,(size_t)local_38.m_s);
      local_39 = false;
      OVar3 = ON_BinaryArchive::CurrentPosition(archive);
      bVar2 = ON_BinaryArchive::ReadCompressedBuffer
                        (archive,(size_t)local_38.m_s,
                         (pCVar1->m_data).m_buffer._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,&local_39);
      if ((bVar2) || (local_39 != false)) {
        OVar4 = ON_BinaryArchive::CurrentPosition(archive);
        (pCVar1->m_data).m_compressed_length = OVar4 - OVar3;
        bVar2 = true;
        goto LAB_0045a49d;
      }
      goto LAB_0045a489;
    }
    (pCVar1->m_data).m_error = true;
  }
  else {
LAB_0045a489:
    (this->m_impl->m_data).m_error = true;
  }
  bVar2 = false;
LAB_0045a49d:
  ON_wString::~ON_wString(&local_30);
  return bVar2;
}

Assistant:

bool ON_EmbeddedFile::Read(ON_BinaryArchive& archive)
{
  Clear();

  // Read the full file path of the original file.
  ON_wString filename;
  if (!archive.ReadString(filename))
  {
    m_impl->m_data.m_error = true;
    return false;
  }

  m_impl->m_orig_file = ON_FileSystemPath::CleanPath(filename);

  // Read the original (uncompressed) size of the compressed buffer.
  size_t uncompressed_size = 0;
  if (!archive.ReadCompressedBufferSize(&uncompressed_size))
  {
    m_impl->m_data.m_error = true;
    return false;
  }

  // Allocate a buffer for the uncompressed data.
  auto& d = m_impl->m_data;
  d.SetLength(uncompressed_size);

  // Read the compressed buffer and uncompress it into uncompressed_buffer.
  bool bFailedCRC = false;

  const ON__UINT64 pos_before = archive.CurrentPosition();

  if (!archive.ReadCompressedBuffer(uncompressed_size, d.m_buffer.get(), &bFailedCRC) && !bFailedCRC)
  {
    m_impl->m_data.m_error = true;
    return false;
  }

  d.m_compressed_length = size_t(archive.CurrentPosition() - pos_before);

  return true;
}